

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQInteger SVar2;
  long in_RDX;
  HSQUIRRELVM in_RDI;
  SQObjectPtr t;
  SQObjectPtr *key;
  SQObjectPtr *self;
  SQInteger in_stack_ffffffffffffff98;
  SQVM *in_stack_ffffffffffffffa0;
  SQObjectPtr *this;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  SQInteger in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQRESULT local_8;
  
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 2) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    local_8 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffcc,(SQObjectPtr **)in_stack_ffffffffffffffc0);
    if (bVar1) {
      SQVM::GetUp(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      this = (SQObjectPtr *)&stack0xffffffffffffffc0;
      SQObjectPtr::SQObjectPtr(this);
      bVar1 = SQTable::Get((SQTable *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb0);
      if (bVar1) {
        SQTable::Remove((SQTable *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),this);
      }
      if (in_RDX == 0) {
        SQVM::Pop((SQVM *)0x11920a);
      }
      else {
        in_stack_ffffffffffffffa0 =
             (SQVM *)SQVM::GetUp(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        SQObjectPtr::operator=((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),this);
      }
      local_8 = 0;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
    }
    else {
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    SQObjectPtr t;
    if(_table(*self)->Get(key,t)) {
        _table(*self)->Remove(key);
    }
    if(pushval != 0)
        v->GetUp(-1) = t;
    else
        v->Pop();
    return SQ_OK;
}